

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::FindFieldByName
          (NoFieldPresenceSwapFieldTest *this,string_view field_name)

{
  Nullable<const_char_*> failure_msg;
  FieldDescriptor *f1;
  FieldDescriptor *f2;
  FieldDescriptor *local_40;
  FieldDescriptor *local_38;
  LogMessageFatal local_30;
  
  local_40 = Descriptor::FindFieldByName(this->d1_,field_name);
  local_38 = Descriptor::FindFieldByName(this->d2_,field_name);
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                          (&local_40,&local_38,"f1 == f2");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return local_40;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
             ,0x16b,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

const FieldDescriptor* FindFieldByName(absl::string_view field_name) {
    const FieldDescriptor* f1 = d1_->FindFieldByName(field_name);
    const FieldDescriptor* f2 = d2_->FindFieldByName(field_name);

    // We actually ensure uniqueness of *field descriptors* even if we try to
    // obtain them from different *message descriptors*.
    ABSL_CHECK_EQ(f1, f2);
    return f1;
  }